

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  int *piVar3;
  BYTE *pBVar4;
  ulong *puVar5;
  undefined8 *puVar6;
  uint uVar7;
  BYTE *pBVar8;
  U32 *pUVar9;
  BYTE *pBVar10;
  uint uVar11;
  undefined8 uVar12;
  uint uVar13;
  BYTE *pStart;
  ulong uVar14;
  ulong *puVar15;
  ulong *puVar16;
  byte bVar17;
  ulong *puVar18;
  ulong *puVar19;
  seqDef *psVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  int *piVar27;
  uint uVar28;
  ulong uVar29;
  int *piVar30;
  int iVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  uint uVar35;
  U32 UVar36;
  ulong *puVar37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  BYTE *iend;
  BYTE *pInLoopLimit;
  BYTE *ilimit;
  BYTE *litLimit_w_2;
  BYTE *base;
  U32 *hashTable;
  BYTE *litLimit_w;
  U32 prefixStartIndex;
  BYTE *prefixStart;
  size_t stepSize;
  ulong *local_d8;
  int local_6c;
  
  if (ms->dictMatchState != (ZSTD_matchState_t *)0x0) {
    __assert_fail("ms->dictMatchState == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x3da5,
                  "size_t ZSTD_compressBlock_fast(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar35 = (ms->cParams).minMatch;
  uVar7 = (ms->cParams).targetLength;
  uVar14 = (ulong)(uVar7 + 1 + (uint)(uVar7 == 0));
  pBVar8 = (ms->window).base;
  puVar2 = (ulong *)((long)src + srcSize);
  iVar38 = (int)pBVar8;
  iVar31 = (int)puVar2 - iVar38;
  uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar7 = (ms->window).dictLimit;
  uVar11 = iVar31 - uVar13;
  if (iVar31 - uVar7 <= uVar13) {
    uVar11 = uVar7;
  }
  pUVar9 = ms->hashTable;
  piVar3 = (int *)(pBVar8 + uVar11);
  uVar7 = *rep;
  uVar13 = rep[1];
  local_d8 = (ulong *)((long)src + (ulong)(piVar3 == (int *)src));
  uVar32 = (int)local_d8 - (int)piVar3;
  uVar40 = 0;
  uVar22 = (ulong)uVar13;
  if (uVar32 < uVar13) {
    uVar22 = uVar40;
  }
  uVar33 = (uint)uVar22;
  if (uVar7 <= uVar32) {
    uVar40 = (ulong)uVar7;
  }
  uVar25 = (uint)uVar40;
  puVar5 = (ulong *)((long)src + (srcSize - 8));
  puVar15 = (ulong *)((long)src + (ulong)(piVar3 == (int *)src) + 1);
  puVar37 = (ulong *)src;
  if (uVar35 == 5) {
    if (puVar15 < puVar5) {
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar18 = puVar2 + -4;
      do {
        uVar21 = *local_d8;
        uVar26 = uVar21 * -0x30e4432345000000 >> (bVar17 & 0x3f);
        uVar34 = *puVar15;
        uVar29 = uVar34 * -0x30e4432345000000 >> (bVar17 & 0x3f);
        uVar39 = (long)local_d8 - (long)pBVar8;
        uVar35 = pUVar9[uVar26];
        uVar33 = pUVar9[uVar29];
        UVar36 = (U32)uVar39;
        pUVar9[uVar26] = UVar36;
        pUVar9[uVar29] = (int)puVar15 - iVar38;
        if ((ulong *)((long)local_d8 + 1U) != puVar15) goto LAB_00113406;
        uVar25 = (uint)uVar40;
        if (uVar25 == 0) {
LAB_00112654:
          if (((uVar11 < uVar35) &&
              (piVar30 = (int *)(pBVar8 + uVar35), puVar16 = local_d8, *piVar30 == (int)uVar21)) ||
             ((uVar11 < uVar33 &&
              (piVar30 = (int *)(pBVar8 + uVar33), puVar16 = puVar15, *piVar30 == (int)uVar34)))) {
            local_d8 = puVar16;
            uVar35 = (int)local_d8 - (int)piVar30;
            uVar21 = (ulong)uVar35;
            iVar31 = uVar35 + 2;
            uVar22 = uVar40;
            if ((piVar3 < piVar30) && (puVar37 < local_d8)) {
              uVar34 = 0;
              do {
                puVar15 = (ulong *)((long)local_d8 + -1);
                piVar27 = (int *)((long)piVar30 + -1);
                if ((*(char *)puVar15 != *(char *)piVar27) ||
                   (uVar34 = uVar34 + 1, piVar30 = piVar27, local_d8 = puVar15, piVar27 <= piVar3))
                break;
              } while (puVar37 < puVar15);
            }
            else {
              uVar34 = 0;
            }
            goto LAB_0011271d;
          }
          uVar40 = ((ulong)((long)local_d8 - (long)puVar37) >> 7) + uVar14;
          if (uVar40 < 2) goto LAB_00113444;
          puVar15 = (ulong *)((long)puVar15 + uVar40);
          local_d8 = (ulong *)((long)local_d8 + uVar40);
        }
        else {
          piVar27 = (int *)((long)local_d8 + 2);
          piVar30 = (int *)((long)piVar27 - uVar40);
          if (*piVar30 != *piVar27) goto LAB_00112654;
          uVar34 = (ulong)(*(char *)((long)local_d8 + 1U) == *(char *)((long)piVar30 + -1));
          iVar31 = 0;
          piVar30 = (int *)((long)piVar30 - uVar34);
          uVar21 = uVar40;
          local_d8 = (ulong *)((long)piVar27 - uVar34);
LAB_0011271d:
          puVar16 = (ulong *)((long)local_d8 + uVar34 + 4);
          puVar19 = (ulong *)((long)piVar30 + uVar34 + 4);
          puVar15 = puVar16;
          if (puVar16 < puVar1) {
            if (*puVar19 == *puVar16) {
              lVar23 = 0;
              do {
                puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                if (puVar1 <= puVar15) {
                  puVar19 = (ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                  puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                  goto LAB_001127af;
                }
                uVar40 = *(ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                uVar26 = *puVar15;
                lVar23 = lVar23 + 8;
              } while (uVar40 == uVar26);
              uVar26 = uVar26 ^ uVar40;
              uVar40 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar23;
            }
            else {
              uVar26 = *puVar16 ^ *puVar19;
              uVar40 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001127af:
            if ((puVar15 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar15 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar15 < puVar2) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
            }
            uVar40 = (long)puVar15 - (long)puVar16;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001133a9;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
          uVar26 = (long)local_d8 - (long)puVar37;
          puVar15 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar15 + uVar26))
          goto LAB_0011336b;
          if (puVar2 < local_d8) goto LAB_0011338a;
          if (puVar18 < local_d8) {
            ZSTD_safecopyLiterals((BYTE *)puVar15,(BYTE *)puVar37,(BYTE *)local_d8,(BYTE *)puVar18);
LAB_0011286c:
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              if (seqStore->longLengthID != 0) goto LAB_00113463;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar29 = puVar37[1];
            *puVar15 = *puVar37;
            puVar15[1] = uVar29;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar26) {
              lVar23 = (long)(pBVar10 + 0x10) - (long)(puVar37 + 2);
              if (lVar23 < 8) {
                if (-0x10 < lVar23) goto LAB_00113482;
              }
              else if (0xffffffffffffffe0 < lVar23 - 0x10U) goto LAB_001134a1;
              uVar29 = puVar37[3];
              *(ulong *)(pBVar10 + 0x10) = puVar37[2];
              *(ulong *)(pBVar10 + 0x18) = uVar29;
              if (0x20 < (long)uVar26) {
                lVar23 = 0;
                do {
                  puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x20);
                  uVar12 = puVar6[1];
                  pBVar4 = pBVar10 + lVar23 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar12;
                  puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x30);
                  uVar12 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar12;
                  lVar23 = lVar23 + 0x20;
                } while (pBVar4 + 0x20 < pBVar10 + uVar26);
              }
              goto LAB_0011286c;
            }
            seqStore->lit = pBVar10 + uVar26;
          }
          uVar29 = uVar40 + uVar34 + 1;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar26;
          psVar20->offset = iVar31 + 1;
          if (0xffff < uVar29) {
            if (seqStore->longLengthID != 0) goto LAB_001133e7;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->matchLength = (U16)uVar29;
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          puVar37 = (ulong *)((long)local_d8 + uVar40 + uVar34 + 4);
          puVar15 = (ulong *)((long)local_d8 + uVar40 + uVar34 + 5);
          if (puVar37 <= puVar5) {
            if (pBVar8 + (uVar39 & 0xffffffff) + 2 <= src) goto LAB_00113425;
            pUVar9[(ulong)(*(long *)(pBVar8 + (uVar39 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar17 & 0x3f)] = UVar36 + 2;
            pUVar9[(ulong)(*(long *)((long)puVar37 - 2) * -0x30e4432345000000) >> (bVar17 & 0x3f)] =
                 ((int)puVar37 + -2) - iVar38;
            if ((int)uVar22 == 0) {
              uVar22 = 0;
            }
            else {
              uVar40 = uVar22;
              if ((int)*puVar37 == *(int *)((long)puVar37 - uVar22)) {
                do {
                  puVar15 = puVar37;
                  uVar22 = uVar21;
                  uVar21 = uVar40;
                  lVar23 = -uVar21;
                  puVar37 = (ulong *)((long)puVar15 + 4);
                  puVar19 = (ulong *)((long)puVar15 + lVar23 + 4);
                  puVar16 = puVar37;
                  if (puVar37 < puVar1) {
                    if (*puVar19 == *puVar37) {
                      lVar24 = 0;
                      do {
                        puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                        if (puVar1 <= puVar16) {
                          puVar19 = (ulong *)((long)puVar15 + lVar23 + lVar24 + 0xc);
                          puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                          goto LAB_00112a6d;
                        }
                        uVar40 = *(ulong *)((long)puVar15 + lVar24 + lVar23 + 0xc);
                        uVar34 = *puVar16;
                        lVar24 = lVar24 + 8;
                      } while (uVar40 == uVar34);
                      uVar34 = uVar34 ^ uVar40;
                      uVar40 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar34 = (uVar40 >> 3 & 0x1fffffff) + lVar24;
                    }
                    else {
                      uVar34 = *puVar37 ^ *puVar19;
                      uVar40 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                        }
                      }
                      uVar34 = uVar40 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_00112a6d:
                    if ((puVar16 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar16)
                       ) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar16 < (ulong *)((long)puVar2 - 1U)) &&
                       ((short)*puVar19 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar16 < puVar2) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar19 == (char)*puVar16))
                      ;
                    }
                    uVar34 = (long)puVar16 - (long)puVar37;
                  }
                  uVar25 = (uint)uVar21;
                  pUVar9[*puVar15 * -0x30e4432345000000 >> (bVar17 & 0x3f)] = (int)puVar15 - iVar38;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3))
                  goto LAB_001133a9;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
                  puVar37 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar37) goto LAB_0011336b;
                  if (puVar2 < puVar15) goto LAB_0011338a;
                  if (puVar18 < puVar15) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar37,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar18);
                  }
                  else {
                    uVar40 = puVar15[1];
                    *puVar37 = *puVar15;
                    puVar37[1] = uVar40;
                  }
                  psVar20 = seqStore->sequences;
                  psVar20->litLength = 0;
                  psVar20->offset = 1;
                  if (0xffff < uVar34 + 1) {
                    if (seqStore->longLengthID != 0) goto LAB_001133e7;
                    seqStore->longLengthID = 2;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                  }
                  puVar37 = (ulong *)((long)puVar15 + uVar34 + 4);
                  psVar20->matchLength = (U16)(uVar34 + 1);
                  psVar20 = psVar20 + 1;
                  seqStore->sequences = psVar20;
                } while ((((int)uVar22 != 0) && (puVar37 <= puVar5)) &&
                        (uVar40 = uVar22, (int)*puVar37 == *(int *)((long)puVar37 - uVar22)));
                puVar15 = (ulong *)((long)puVar15 + uVar34 + 5);
                local_d8 = puVar37;
                goto LAB_00112bc6;
              }
            }
          }
          uVar25 = (uint)uVar21;
          local_d8 = puVar37;
        }
LAB_00112bc6:
        uVar33 = (uint)uVar22;
        uVar40 = (ulong)uVar25;
      } while (puVar15 < puVar5);
    }
  }
  else if (uVar35 == 6) {
    if (puVar15 < puVar5) {
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar18 = puVar2 + -4;
      do {
        uVar21 = *local_d8;
        uVar26 = uVar21 * -0x30e4432340650000 >> (bVar17 & 0x3f);
        uVar34 = *puVar15;
        uVar29 = uVar34 * -0x30e4432340650000 >> (bVar17 & 0x3f);
        uVar39 = (long)local_d8 - (long)pBVar8;
        uVar35 = pUVar9[uVar26];
        uVar33 = pUVar9[uVar29];
        UVar36 = (U32)uVar39;
        pUVar9[uVar26] = UVar36;
        pUVar9[uVar29] = (int)puVar15 - iVar38;
        if ((ulong *)((long)local_d8 + 1U) != puVar15) goto LAB_00113406;
        if ((int)uVar40 == 0) {
LAB_00111f8d:
          if (((uVar11 < uVar35) &&
              (piVar30 = (int *)(pBVar8 + uVar35), puVar16 = local_d8, *piVar30 == (int)uVar21)) ||
             ((uVar11 < uVar33 &&
              (piVar30 = (int *)(pBVar8 + uVar33), puVar16 = puVar15, *piVar30 == (int)uVar34)))) {
            local_d8 = puVar16;
            uVar35 = (int)local_d8 - (int)piVar30;
            uVar21 = (ulong)uVar35;
            local_6c = uVar35 + 2;
            uVar22 = uVar40;
            if ((piVar3 < piVar30) && (puVar37 < local_d8)) {
              uVar34 = 0;
              do {
                puVar15 = (ulong *)((long)local_d8 + -1);
                piVar27 = (int *)((long)piVar30 + -1);
                if ((*(char *)puVar15 != *(char *)piVar27) ||
                   (uVar34 = uVar34 + 1, piVar30 = piVar27, local_d8 = puVar15, piVar27 <= piVar3))
                break;
              } while (puVar37 < puVar15);
            }
            else {
              uVar34 = 0;
            }
            goto LAB_0011205a;
          }
          uVar21 = ((ulong)((long)local_d8 - (long)puVar37) >> 7) + uVar14;
          if (uVar21 < 2) goto LAB_00113444;
          puVar15 = (ulong *)((long)puVar15 + uVar21);
          local_d8 = (ulong *)((long)local_d8 + uVar21);
        }
        else {
          piVar27 = (int *)((long)local_d8 + 2);
          piVar30 = (int *)((long)piVar27 - uVar40);
          if (*piVar30 != *piVar27) goto LAB_00111f8d;
          uVar34 = (ulong)(*(char *)((long)local_d8 + 1U) == *(char *)((long)piVar30 + -1));
          local_6c = 0;
          piVar30 = (int *)((long)piVar30 - uVar34);
          uVar21 = uVar40;
          local_d8 = (ulong *)((long)piVar27 - uVar34);
LAB_0011205a:
          uVar40 = uVar21;
          puVar16 = (ulong *)((long)local_d8 + uVar34 + 4);
          puVar19 = (ulong *)((long)piVar30 + uVar34 + 4);
          puVar15 = puVar16;
          if (puVar16 < puVar1) {
            if (*puVar19 == *puVar16) {
              lVar23 = 0;
              do {
                puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                if (puVar1 <= puVar15) {
                  puVar19 = (ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                  puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                  goto LAB_001120ea;
                }
                uVar21 = *(ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                uVar26 = *puVar15;
                lVar23 = lVar23 + 8;
              } while (uVar21 == uVar26);
              uVar26 = uVar26 ^ uVar21;
              uVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar23;
            }
            else {
              uVar26 = *puVar16 ^ *puVar19;
              uVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001120ea:
            if ((puVar15 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar15 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar15 < puVar2) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
            }
            uVar21 = (long)puVar15 - (long)puVar16;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_001133a9;
          if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
          uVar26 = (long)local_d8 - (long)puVar37;
          puVar15 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar15 + uVar26))
          goto LAB_0011336b;
          if (puVar2 < local_d8) goto LAB_0011338a;
          if (puVar18 < local_d8) {
            ZSTD_safecopyLiterals((BYTE *)puVar15,(BYTE *)puVar37,(BYTE *)local_d8,(BYTE *)puVar18);
LAB_0011219e:
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              if (seqStore->longLengthID != 0) goto LAB_00113463;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar29 = puVar37[1];
            *puVar15 = *puVar37;
            puVar15[1] = uVar29;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar26) {
              lVar23 = (long)(pBVar10 + 0x10) - (long)(puVar37 + 2);
              if (lVar23 < 8) {
                if (-0x10 < lVar23) goto LAB_00113482;
              }
              else if (0xffffffffffffffe0 < lVar23 - 0x10U) goto LAB_001134a1;
              uVar29 = puVar37[3];
              *(ulong *)(pBVar10 + 0x10) = puVar37[2];
              *(ulong *)(pBVar10 + 0x18) = uVar29;
              if (0x20 < (long)uVar26) {
                lVar23 = 0;
                do {
                  puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x20);
                  uVar12 = puVar6[1];
                  pBVar4 = pBVar10 + lVar23 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar12;
                  puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x30);
                  uVar12 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar12;
                  lVar23 = lVar23 + 0x20;
                } while (pBVar4 + 0x20 < pBVar10 + uVar26);
              }
              goto LAB_0011219e;
            }
            seqStore->lit = pBVar10 + uVar26;
          }
          uVar29 = uVar21 + uVar34 + 1;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar26;
          psVar20->offset = local_6c + 1;
          if (0xffff < uVar29) {
            if (seqStore->longLengthID != 0) goto LAB_001133e7;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->matchLength = (U16)uVar29;
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          puVar37 = (ulong *)((long)local_d8 + uVar21 + uVar34 + 4);
          puVar15 = (ulong *)((long)local_d8 + uVar21 + uVar34 + 5);
          local_d8 = puVar37;
          if (puVar37 <= puVar5) {
            if (pBVar8 + (uVar39 & 0xffffffff) + 2 <= src) goto LAB_00113425;
            pUVar9[(ulong)(*(long *)(pBVar8 + (uVar39 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar17 & 0x3f)] = UVar36 + 2;
            pUVar9[(ulong)(*(long *)((long)puVar37 - 2) * -0x30e4432340650000) >> (bVar17 & 0x3f)] =
                 ((int)puVar37 + -2) - iVar38;
            if ((int)uVar22 == 0) {
              uVar22 = 0;
            }
            else {
              uVar21 = uVar40;
              if ((int)*puVar37 == *(int *)((long)puVar37 - uVar22)) {
                do {
                  uVar40 = uVar22;
                  puVar15 = puVar37;
                  uVar22 = uVar21;
                  lVar23 = -uVar40;
                  puVar37 = (ulong *)((long)puVar15 + 4);
                  puVar19 = (ulong *)((long)puVar15 + lVar23 + 4);
                  puVar16 = puVar37;
                  if (puVar37 < puVar1) {
                    if (*puVar19 == *puVar37) {
                      lVar24 = 0;
                      do {
                        puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                        if (puVar1 <= puVar16) {
                          puVar19 = (ulong *)((long)puVar15 + lVar23 + lVar24 + 0xc);
                          puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                          goto LAB_00112389;
                        }
                        uVar21 = *(ulong *)((long)puVar15 + lVar24 + lVar23 + 0xc);
                        uVar34 = *puVar16;
                        lVar24 = lVar24 + 8;
                      } while (uVar21 == uVar34);
                      uVar34 = uVar34 ^ uVar21;
                      uVar21 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      uVar34 = (uVar21 >> 3 & 0x1fffffff) + lVar24;
                    }
                    else {
                      uVar34 = *puVar37 ^ *puVar19;
                      uVar21 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      uVar34 = uVar21 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_00112389:
                    if ((puVar16 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar16)
                       ) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar16 < (ulong *)((long)puVar2 - 1U)) &&
                       ((short)*puVar19 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar16 < puVar2) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar19 == (char)*puVar16))
                      ;
                    }
                    uVar34 = (long)puVar16 - (long)puVar37;
                  }
                  pUVar9[*puVar15 * -0x30e4432340650000 >> (bVar17 & 0x3f)] = (int)puVar15 - iVar38;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3))
                  goto LAB_001133a9;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
                  puVar37 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar37) goto LAB_0011336b;
                  if (puVar2 < puVar15) goto LAB_0011338a;
                  if (puVar18 < puVar15) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar37,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar18);
                  }
                  else {
                    uVar21 = puVar15[1];
                    *puVar37 = *puVar15;
                    puVar37[1] = uVar21;
                  }
                  psVar20 = seqStore->sequences;
                  psVar20->litLength = 0;
                  psVar20->offset = 1;
                  if (0xffff < uVar34 + 1) {
                    if (seqStore->longLengthID != 0) goto LAB_001133e7;
                    seqStore->longLengthID = 2;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                  }
                  puVar37 = (ulong *)((long)puVar15 + uVar34 + 4);
                  psVar20->matchLength = (U16)(uVar34 + 1);
                  psVar20 = psVar20 + 1;
                  seqStore->sequences = psVar20;
                } while ((((int)uVar22 != 0) && (puVar37 <= puVar5)) &&
                        (uVar21 = uVar40, (int)*puVar37 == *(int *)((long)puVar37 - uVar22)));
                puVar15 = (ulong *)((long)puVar15 + uVar34 + 5);
                local_d8 = puVar37;
              }
            }
          }
        }
        uVar33 = (uint)uVar22;
        uVar25 = (uint)uVar40;
      } while (puVar15 < puVar5);
    }
  }
  else if (uVar35 == 7) {
    if (puVar15 < puVar5) {
      bVar17 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      puVar18 = puVar2 + -4;
      do {
        uVar21 = *local_d8;
        uVar26 = uVar21 * -0x30e44323405a9d00 >> (bVar17 & 0x3f);
        uVar34 = *puVar15;
        uVar29 = uVar34 * -0x30e44323405a9d00 >> (bVar17 & 0x3f);
        uVar39 = (long)local_d8 - (long)pBVar8;
        uVar35 = pUVar9[uVar26];
        uVar33 = pUVar9[uVar29];
        UVar36 = (U32)uVar39;
        pUVar9[uVar26] = UVar36;
        pUVar9[uVar29] = (int)puVar15 - iVar38;
        if ((ulong *)((long)local_d8 + 1U) != puVar15) {
LAB_00113406:
          __assert_fail("ip0 + 1 == ip1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3d56,
                        "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                       );
        }
        if ((int)uVar40 == 0) {
LAB_001118b1:
          if (((uVar11 < uVar35) &&
              (piVar30 = (int *)(pBVar8 + uVar35), puVar16 = local_d8, *piVar30 == (int)uVar21)) ||
             ((uVar11 < uVar33 &&
              (piVar30 = (int *)(pBVar8 + uVar33), puVar16 = puVar15, *piVar30 == (int)uVar34)))) {
            local_d8 = puVar16;
            uVar35 = (int)local_d8 - (int)piVar30;
            uVar21 = (ulong)uVar35;
            local_6c = uVar35 + 2;
            uVar22 = uVar40;
            if ((piVar3 < piVar30) && (puVar37 < local_d8)) {
              uVar34 = 0;
              do {
                puVar15 = (ulong *)((long)local_d8 + -1);
                piVar27 = (int *)((long)piVar30 + -1);
                if ((*(char *)puVar15 != *(char *)piVar27) ||
                   (uVar34 = uVar34 + 1, piVar30 = piVar27, local_d8 = puVar15, piVar27 <= piVar3))
                break;
              } while (puVar37 < puVar15);
            }
            else {
              uVar34 = 0;
            }
            goto LAB_0011197e;
          }
          uVar21 = ((ulong)((long)local_d8 - (long)puVar37) >> 7) + uVar14;
          if (uVar21 < 2) {
LAB_00113444:
            __assert_fail("step >= 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x3d6a,
                          "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                         );
          }
          puVar15 = (ulong *)((long)puVar15 + uVar21);
          local_d8 = (ulong *)((long)local_d8 + uVar21);
        }
        else {
          piVar27 = (int *)((long)local_d8 + 2);
          piVar30 = (int *)((long)piVar27 - uVar40);
          if (*piVar30 != *piVar27) goto LAB_001118b1;
          uVar34 = (ulong)(*(char *)((long)local_d8 + 1U) == *(char *)((long)piVar30 + -1));
          local_6c = 0;
          piVar30 = (int *)((long)piVar30 - uVar34);
          uVar21 = uVar40;
          local_d8 = (ulong *)((long)piVar27 - uVar34);
LAB_0011197e:
          uVar40 = uVar21;
          puVar16 = (ulong *)((long)local_d8 + uVar34 + 4);
          puVar19 = (ulong *)((long)piVar30 + uVar34 + 4);
          puVar15 = puVar16;
          if (puVar16 < puVar1) {
            if (*puVar19 == *puVar16) {
              lVar23 = 0;
              do {
                puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                if (puVar1 <= puVar15) {
                  puVar19 = (ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                  puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                  goto LAB_00111a0e;
                }
                uVar21 = *(ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                uVar26 = *puVar15;
                lVar23 = lVar23 + 8;
              } while (uVar21 == uVar26);
              uVar26 = uVar26 ^ uVar21;
              uVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar23;
            }
            else {
              uVar26 = *puVar16 ^ *puVar19;
              uVar21 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00111a0e:
            if ((puVar15 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 4);
              puVar19 = (ulong *)((long)puVar19 + 4);
            }
            if ((puVar15 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar15)) {
              puVar15 = (ulong *)((long)puVar15 + 2);
              puVar19 = (ulong *)((long)puVar19 + 2);
            }
            if (puVar15 < puVar2) {
              puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
            }
            uVar21 = (long)puVar15 - (long)puVar16;
          }
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001133a9:
            __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x2038,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (0x20000 < seqStore->maxNbLit) {
LAB_001133c8:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          uVar26 = (long)local_d8 - (long)puVar37;
          puVar15 = (ulong *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar15 + uVar26)) {
LAB_0011336b:
            __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203b,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar2 < local_d8) {
LAB_0011338a:
            __assert_fail("literals + litLength <= litLimit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203c,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          if (puVar18 < local_d8) {
            ZSTD_safecopyLiterals((BYTE *)puVar15,(BYTE *)puVar37,(BYTE *)local_d8,(BYTE *)puVar18);
LAB_00111ac2:
            seqStore->lit = seqStore->lit + uVar26;
            if (0xffff < uVar26) {
              if (seqStore->longLengthID != 0) {
LAB_00113463:
                __assert_fail("seqStorePtr->longLengthID == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x204d,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            uVar29 = puVar37[1];
            *puVar15 = *puVar37;
            puVar15[1] = uVar29;
            pBVar10 = seqStore->lit;
            if (0x10 < uVar26) {
              lVar23 = (long)(pBVar10 + 0x10) - (long)(puVar37 + 2);
              if (lVar23 < 8) {
                if (-0x10 < lVar23) {
LAB_00113482:
                  __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x1268,
                                "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                               );
                }
              }
              else if (0xffffffffffffffe0 < lVar23 - 0x10U) {
LAB_001134a1:
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x1270,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              uVar29 = puVar37[3];
              *(ulong *)(pBVar10 + 0x10) = puVar37[2];
              *(ulong *)(pBVar10 + 0x18) = uVar29;
              if (0x20 < (long)uVar26) {
                lVar23 = 0;
                do {
                  puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x20);
                  uVar12 = puVar6[1];
                  pBVar4 = pBVar10 + lVar23 + 0x20;
                  *(undefined8 *)pBVar4 = *puVar6;
                  *(undefined8 *)(pBVar4 + 8) = uVar12;
                  puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x30);
                  uVar12 = puVar6[1];
                  *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                  *(undefined8 *)(pBVar4 + 0x18) = uVar12;
                  lVar23 = lVar23 + 0x20;
                } while (pBVar4 + 0x20 < pBVar10 + uVar26);
              }
              goto LAB_00111ac2;
            }
            seqStore->lit = pBVar10 + uVar26;
          }
          uVar29 = uVar21 + uVar34 + 1;
          psVar20 = seqStore->sequences;
          psVar20->litLength = (U16)uVar26;
          psVar20->offset = local_6c + 1;
          if (0xffff < uVar29) {
            if (seqStore->longLengthID != 0) {
LAB_001133e7:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar20->matchLength = (U16)uVar29;
          psVar20 = psVar20 + 1;
          seqStore->sequences = psVar20;
          puVar37 = (ulong *)((long)local_d8 + uVar21 + uVar34 + 4);
          puVar15 = (ulong *)((long)local_d8 + uVar21 + uVar34 + 5);
          local_d8 = puVar37;
          if (puVar37 <= puVar5) {
            if (pBVar8 + (uVar39 & 0xffffffff) + 2 <= src) {
LAB_00113425:
              __assert_fail("base+current0+2 > istart",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x3d84,
                            "size_t ZSTD_compressBlock_fast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                           );
            }
            pUVar9[(ulong)(*(long *)(pBVar8 + (uVar39 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar17 & 0x3f)] = UVar36 + 2;
            pUVar9[(ulong)(*(long *)((long)puVar37 - 2) * -0x30e44323405a9d00) >> (bVar17 & 0x3f)] =
                 ((int)puVar37 + -2) - iVar38;
            if ((int)uVar22 == 0) {
              uVar22 = 0;
            }
            else {
              uVar21 = uVar40;
              if ((int)*puVar37 == *(int *)((long)puVar37 - uVar22)) {
                do {
                  uVar40 = uVar22;
                  puVar15 = puVar37;
                  uVar22 = uVar21;
                  lVar23 = -uVar40;
                  puVar37 = (ulong *)((long)puVar15 + 4);
                  puVar19 = (ulong *)((long)puVar15 + lVar23 + 4);
                  puVar16 = puVar37;
                  if (puVar37 < puVar1) {
                    if (*puVar19 == *puVar37) {
                      lVar24 = 0;
                      do {
                        puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                        if (puVar1 <= puVar16) {
                          puVar19 = (ulong *)((long)puVar15 + lVar23 + lVar24 + 0xc);
                          puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                          goto LAB_00111cad;
                        }
                        uVar21 = *(ulong *)((long)puVar15 + lVar24 + lVar23 + 0xc);
                        uVar34 = *puVar16;
                        lVar24 = lVar24 + 8;
                      } while (uVar21 == uVar34);
                      uVar34 = uVar34 ^ uVar21;
                      uVar21 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      uVar34 = (uVar21 >> 3 & 0x1fffffff) + lVar24;
                    }
                    else {
                      uVar34 = *puVar37 ^ *puVar19;
                      uVar21 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                        }
                      }
                      uVar34 = uVar21 >> 3 & 0x1fffffff;
                    }
                  }
                  else {
LAB_00111cad:
                    if ((puVar16 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar16)
                       ) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar16 < (ulong *)((long)puVar2 - 1U)) &&
                       ((short)*puVar19 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar16 < puVar2) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar19 == (char)*puVar16))
                      ;
                    }
                    uVar34 = (long)puVar16 - (long)puVar37;
                  }
                  pUVar9[*puVar15 * -0x30e44323405a9d00 >> (bVar17 & 0x3f)] = (int)puVar15 - iVar38;
                  if (seqStore->maxNbSeq <=
                      (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3))
                  goto LAB_001133a9;
                  if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
                  puVar37 = (ulong *)seqStore->lit;
                  if (seqStore->litStart + seqStore->maxNbLit < puVar37) goto LAB_0011336b;
                  if (puVar2 < puVar15) goto LAB_0011338a;
                  if (puVar18 < puVar15) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)puVar37,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar18);
                  }
                  else {
                    uVar21 = puVar15[1];
                    *puVar37 = *puVar15;
                    puVar37[1] = uVar21;
                  }
                  psVar20 = seqStore->sequences;
                  psVar20->litLength = 0;
                  psVar20->offset = 1;
                  if (0xffff < uVar34 + 1) {
                    if (seqStore->longLengthID != 0) goto LAB_001133e7;
                    seqStore->longLengthID = 2;
                    seqStore->longLengthPos =
                         (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                  }
                  puVar37 = (ulong *)((long)puVar15 + uVar34 + 4);
                  psVar20->matchLength = (U16)(uVar34 + 1);
                  psVar20 = psVar20 + 1;
                  seqStore->sequences = psVar20;
                } while ((((int)uVar22 != 0) && (puVar37 <= puVar5)) &&
                        (uVar21 = uVar40, (int)*puVar37 == *(int *)((long)puVar37 - uVar22)));
                puVar15 = (ulong *)((long)puVar15 + uVar34 + 5);
                local_d8 = puVar37;
              }
            }
          }
        }
        uVar33 = (uint)uVar22;
        uVar25 = (uint)uVar40;
      } while (puVar15 < puVar5);
    }
  }
  else if (puVar15 < puVar5) {
    bVar17 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar2 - 7);
    puVar18 = puVar2 + -4;
    do {
      uVar21 = *local_d8;
      uVar25 = (uint)((int)uVar21 * -0x61c8864f) >> (bVar17 & 0x1f);
      uVar34 = *puVar15;
      uVar28 = (uint)((int)uVar34 * -0x61c8864f) >> (bVar17 & 0x1f);
      uVar26 = (long)local_d8 - (long)pBVar8;
      uVar35 = pUVar9[uVar25];
      uVar33 = pUVar9[uVar28];
      UVar36 = (U32)uVar26;
      pUVar9[uVar25] = UVar36;
      pUVar9[uVar28] = (int)puVar15 - iVar38;
      if ((ulong *)((long)local_d8 + 1U) != puVar15) goto LAB_00113406;
      if ((int)uVar40 == 0) {
LAB_00112d38:
        if (((uVar11 < uVar35) &&
            (piVar30 = (int *)(pBVar8 + uVar35), puVar16 = local_d8, *piVar30 == (int)uVar21)) ||
           ((uVar11 < uVar33 &&
            (piVar30 = (int *)(pBVar8 + uVar33), puVar16 = puVar15, *piVar30 == (int)uVar34)))) {
          local_d8 = puVar16;
          uVar35 = (int)local_d8 - (int)piVar30;
          uVar21 = (ulong)uVar35;
          iVar31 = uVar35 + 2;
          uVar22 = uVar40;
          if ((piVar3 < piVar30) && (puVar37 < local_d8)) {
            uVar34 = 0;
            do {
              puVar15 = (ulong *)((long)local_d8 + -1);
              piVar27 = (int *)((long)piVar30 + -1);
              if ((*(char *)puVar15 != *(char *)piVar27) ||
                 (uVar34 = uVar34 + 1, piVar30 = piVar27, local_d8 = puVar15, piVar27 <= piVar3))
              break;
            } while (puVar37 < puVar15);
          }
          else {
            uVar34 = 0;
          }
          goto LAB_00112e01;
        }
        uVar21 = ((ulong)((long)local_d8 - (long)puVar37) >> 7) + uVar14;
        if (uVar21 < 2) goto LAB_00113444;
        puVar15 = (ulong *)((long)puVar15 + uVar21);
        local_d8 = (ulong *)((long)local_d8 + uVar21);
      }
      else {
        piVar27 = (int *)((long)local_d8 + 2);
        piVar30 = (int *)((long)piVar27 - uVar40);
        if (*piVar30 != *piVar27) goto LAB_00112d38;
        uVar34 = (ulong)(*(char *)((long)local_d8 + 1U) == *(char *)((long)piVar30 + -1));
        iVar31 = 0;
        piVar30 = (int *)((long)piVar30 - uVar34);
        uVar21 = uVar40;
        local_d8 = (ulong *)((long)piVar27 - uVar34);
LAB_00112e01:
        uVar40 = uVar21;
        puVar16 = (ulong *)((long)local_d8 + uVar34 + 4);
        puVar19 = (ulong *)((long)piVar30 + uVar34 + 4);
        puVar15 = puVar16;
        if (puVar16 < puVar1) {
          if (*puVar19 == *puVar16) {
            lVar23 = 0;
            do {
              puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
              if (puVar1 <= puVar15) {
                puVar19 = (ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
                puVar15 = (ulong *)((long)local_d8 + lVar23 + uVar34 + 0xc);
                goto LAB_00112e91;
              }
              uVar21 = *(ulong *)((long)piVar30 + lVar23 + uVar34 + 0xc);
              uVar29 = *puVar15;
              lVar23 = lVar23 + 8;
            } while (uVar21 == uVar29);
            uVar29 = uVar29 ^ uVar21;
            uVar21 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar23;
          }
          else {
            uVar29 = *puVar16 ^ *puVar19;
            uVar21 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar21 = uVar21 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_00112e91:
          if ((puVar15 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 4);
            puVar19 = (ulong *)((long)puVar19 + 4);
          }
          if ((puVar15 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar19 == (short)*puVar15)) {
            puVar15 = (ulong *)((long)puVar15 + 2);
            puVar19 = (ulong *)((long)puVar19 + 2);
          }
          if (puVar15 < puVar2) {
            puVar15 = (ulong *)((long)puVar15 + (ulong)((char)*puVar19 == (char)*puVar15));
          }
          uVar21 = (long)puVar15 - (long)puVar16;
        }
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_001133a9;
        if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
        uVar29 = (long)local_d8 - (long)puVar37;
        puVar15 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar15 + uVar29))
        goto LAB_0011336b;
        if (puVar2 < local_d8) goto LAB_0011338a;
        if (puVar18 < local_d8) {
          ZSTD_safecopyLiterals((BYTE *)puVar15,(BYTE *)puVar37,(BYTE *)local_d8,(BYTE *)puVar18);
LAB_00112f4b:
          seqStore->lit = seqStore->lit + uVar29;
          if (0xffff < uVar29) {
            if (seqStore->longLengthID != 0) goto LAB_00113463;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar39 = puVar37[1];
          *puVar15 = *puVar37;
          puVar15[1] = uVar39;
          pBVar10 = seqStore->lit;
          if (0x10 < uVar29) {
            lVar23 = (long)(pBVar10 + 0x10) - (long)(puVar37 + 2);
            if (lVar23 < 8) {
              if (-0x10 < lVar23) goto LAB_00113482;
            }
            else if (0xffffffffffffffe0 < lVar23 - 0x10U) goto LAB_001134a1;
            uVar39 = puVar37[3];
            *(ulong *)(pBVar10 + 0x10) = puVar37[2];
            *(ulong *)(pBVar10 + 0x18) = uVar39;
            if (0x20 < (long)uVar29) {
              lVar23 = 0;
              do {
                puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x20);
                uVar12 = puVar6[1];
                pBVar4 = pBVar10 + lVar23 + 0x20;
                *(undefined8 *)pBVar4 = *puVar6;
                *(undefined8 *)(pBVar4 + 8) = uVar12;
                puVar6 = (undefined8 *)((long)puVar37 + lVar23 + 0x30);
                uVar12 = puVar6[1];
                *(undefined8 *)(pBVar4 + 0x10) = *puVar6;
                *(undefined8 *)(pBVar4 + 0x18) = uVar12;
                lVar23 = lVar23 + 0x20;
              } while (pBVar4 + 0x20 < pBVar10 + uVar29);
            }
            goto LAB_00112f4b;
          }
          seqStore->lit = pBVar10 + uVar29;
        }
        uVar39 = uVar21 + uVar34 + 1;
        psVar20 = seqStore->sequences;
        psVar20->litLength = (U16)uVar29;
        psVar20->offset = iVar31 + 1;
        if (0xffff < uVar39) {
          if (seqStore->longLengthID != 0) goto LAB_001133e7;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar20->matchLength = (U16)uVar39;
        psVar20 = psVar20 + 1;
        seqStore->sequences = psVar20;
        puVar37 = (ulong *)((long)local_d8 + uVar21 + uVar34 + 4);
        puVar15 = (ulong *)((long)local_d8 + uVar21 + uVar34 + 5);
        local_d8 = puVar37;
        if (puVar37 <= puVar5) {
          if (pBVar8 + (uVar26 & 0xffffffff) + 2 <= src) goto LAB_00113425;
          pUVar9[(uint)(*(int *)(pBVar8 + (uVar26 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar17 & 0x1f)] = UVar36 + 2;
          pUVar9[(uint)(*(int *)((long)puVar37 - 2) * -0x61c8864f) >> (bVar17 & 0x1f)] =
               ((int)puVar37 + -2) - iVar38;
          if ((int)uVar22 == 0) {
            uVar22 = 0;
          }
          else {
            iVar31 = (int)*puVar37;
            uVar21 = uVar22;
            if (iVar31 == *(int *)((long)puVar37 - uVar22)) {
              do {
                puVar15 = puVar37;
                uVar22 = uVar40;
                uVar40 = uVar21;
                lVar23 = -uVar40;
                puVar37 = (ulong *)((long)puVar15 + 4);
                puVar19 = (ulong *)((long)puVar15 + lVar23 + 4);
                puVar16 = puVar37;
                if (puVar37 < puVar1) {
                  if (*puVar19 == *puVar37) {
                    lVar24 = 0;
                    do {
                      puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                      if (puVar1 <= puVar16) {
                        puVar19 = (ulong *)((long)puVar15 + lVar23 + lVar24 + 0xc);
                        puVar16 = (ulong *)((long)puVar15 + lVar24 + 0xc);
                        goto LAB_00113148;
                      }
                      uVar21 = *(ulong *)((long)puVar15 + lVar24 + lVar23 + 0xc);
                      uVar34 = *puVar16;
                      lVar24 = lVar24 + 8;
                    } while (uVar21 == uVar34);
                    uVar34 = uVar34 ^ uVar21;
                    uVar21 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar34 = (uVar21 >> 3 & 0x1fffffff) + lVar24;
                  }
                  else {
                    uVar34 = *puVar37 ^ *puVar19;
                    uVar21 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar34 = uVar21 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00113148:
                  if ((puVar16 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar19 == (int)*puVar16))
                  {
                    puVar16 = (ulong *)((long)puVar16 + 4);
                    puVar19 = (ulong *)((long)puVar19 + 4);
                  }
                  if ((puVar16 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar19 == (short)*puVar16)) {
                    puVar16 = (ulong *)((long)puVar16 + 2);
                    puVar19 = (ulong *)((long)puVar19 + 2);
                  }
                  if (puVar16 < puVar2) {
                    puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar19 == (char)*puVar16));
                  }
                  uVar34 = (long)puVar16 - (long)puVar37;
                }
                pUVar9[(uint)(iVar31 * -0x61c8864f) >> (bVar17 & 0x1f)] = (int)puVar15 - iVar38;
                if (seqStore->maxNbSeq <=
                    (ulong)((long)psVar20 - (long)seqStore->sequencesStart >> 3)) goto LAB_001133a9;
                if (0x20000 < seqStore->maxNbLit) goto LAB_001133c8;
                puVar37 = (ulong *)seqStore->lit;
                if (seqStore->litStart + seqStore->maxNbLit < puVar37) goto LAB_0011336b;
                if (puVar2 < puVar15) goto LAB_0011338a;
                if (puVar18 < puVar15) {
                  ZSTD_safecopyLiterals
                            ((BYTE *)puVar37,(BYTE *)puVar15,(BYTE *)puVar15,(BYTE *)puVar18);
                }
                else {
                  uVar21 = puVar15[1];
                  *puVar37 = *puVar15;
                  puVar37[1] = uVar21;
                }
                psVar20 = seqStore->sequences;
                psVar20->litLength = 0;
                psVar20->offset = 1;
                if (0xffff < uVar34 + 1) {
                  if (seqStore->longLengthID != 0) goto LAB_001133e7;
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar20 - (long)seqStore->sequencesStart) >> 3);
                }
                puVar37 = (ulong *)((long)puVar15 + uVar34 + 4);
                psVar20->matchLength = (U16)(uVar34 + 1);
                psVar20 = psVar20 + 1;
                seqStore->sequences = psVar20;
              } while ((((int)uVar22 != 0) && (puVar37 <= puVar5)) &&
                      (iVar31 = (int)*puVar37, uVar21 = uVar22,
                      iVar31 == *(int *)((long)puVar37 - uVar22)));
              puVar15 = (ulong *)((long)puVar15 + uVar34 + 5);
              local_d8 = puVar37;
            }
          }
        }
      }
      uVar33 = (uint)uVar22;
      uVar25 = (uint)uVar40;
    } while (puVar15 < puVar5);
  }
  uVar35 = 0;
  if (uVar32 < uVar13) {
    uVar35 = uVar13;
  }
  if (uVar32 < uVar7) {
    uVar35 = uVar7;
  }
  if (uVar25 == 0) {
    uVar25 = uVar35;
  }
  if (uVar33 != 0) {
    uVar35 = uVar33;
  }
  *rep = uVar25;
  rep[1] = uVar35;
  return (long)puVar2 - (long)puVar37;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}